

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O3

void __thiscall
EnvironmentNAVXYTHETALAT::GetPredsofChangedEdges
          (EnvironmentNAVXYTHETALAT *this,
          vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *changedcellsV,
          vector<int,_std::allocator<int>_> *preds_of_changededgesIDV)

{
  sbpl_2Dcell_t sVar1;
  iterator __position;
  pointer psVar2;
  int *piVar3;
  pointer psVar4;
  ulong uVar5;
  ulong uVar6;
  long *plVar7;
  pointer psVar8;
  code *pcVar9;
  ulong uVar10;
  long lVar11;
  
  piVar3 = &(this->super_EnvironmentNAVXYTHETALATTICE).iteration;
  *piVar3 = *piVar3 + 1;
  psVar4 = (changedcellsV->super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>).
           _M_impl.super__Vector_impl_data._M_start;
  psVar8 = (changedcellsV->super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)psVar8 - (long)psVar4 >> 3;
  if (0 < (int)uVar5) {
    uVar6 = 0;
    do {
      uVar10 = uVar6;
      if (uVar5 <= uVar6) {
LAB_0012aea9:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar10);
      }
      psVar2 = (this->super_EnvironmentNAVXYTHETALATTICE).affectedpredstatesV.
               super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->super_EnvironmentNAVXYTHETALATTICE).affectedpredstatesV.
                     super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 2) *
              -0x5555555555555555;
      if (0 < (int)uVar5) {
        sVar1 = psVar4[uVar6];
        lVar11 = 8;
        uVar10 = 0;
        do {
          if (uVar5 <= uVar10) goto LAB_0012aea9;
          pcVar9 = (code *)this->GetHashEntry;
          plVar7 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                                   super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                           *(long *)&this->field_0x1c8);
          if (((ulong)pcVar9 & 1) != 0) {
            pcVar9 = *(code **)(pcVar9 + *plVar7 + -1);
          }
          piVar3 = (int *)(*pcVar9)(plVar7,*(int *)((long)psVar2 + lVar11 + -8) + sVar1.x,
                                    *(int *)((long)psVar2 + lVar11 + -4) + sVar1.y,
                                    *(undefined4 *)((long)&psVar2->x + lVar11));
          if ((piVar3 != (int *)0x0) &&
             (piVar3[4] < (this->super_EnvironmentNAVXYTHETALATTICE).iteration)) {
            __position._M_current =
                 (preds_of_changededgesIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (preds_of_changededgesIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)preds_of_changededgesIDV,__position,
                         piVar3);
            }
            else {
              *__position._M_current = *piVar3;
              (preds_of_changededgesIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            piVar3[4] = (this->super_EnvironmentNAVXYTHETALATTICE).iteration;
          }
          uVar10 = uVar10 + 1;
          psVar2 = (this->super_EnvironmentNAVXYTHETALATTICE).affectedpredstatesV.
                   super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar5 = ((long)(this->super_EnvironmentNAVXYTHETALATTICE).affectedpredstatesV.
                         super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 2) *
                  -0x5555555555555555;
          lVar11 = lVar11 + 0xc;
        } while ((long)uVar10 < (long)(int)uVar5);
        psVar4 = (changedcellsV->super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        psVar8 = (changedcellsV->super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar6 = uVar6 + 1;
      uVar5 = (long)psVar8 - (long)psVar4 >> 3;
    } while ((long)uVar6 < (long)(int)((ulong)((long)psVar8 - (long)psVar4) >> 3));
  }
  return;
}

Assistant:

void EnvironmentNAVXYTHETALAT::GetPredsofChangedEdges(
    std::vector<nav2dcell_t> const* changedcellsV,
    std::vector<int>* preds_of_changededgesIDV)
{
    nav2dcell_t cell;
    sbpl_xy_theta_cell_t affectedcell;
    EnvNAVXYTHETALATHashEntry_t* affectedHashEntry;

    // increment iteration for processing savings
    iteration++;

    for (int i = 0; i < (int)changedcellsV->size(); i++) {
        cell = changedcellsV->at(i);

        // now iterate over all states that could potentially be affected
        for (int sind = 0; sind < (int)affectedpredstatesV.size(); sind++) {
            affectedcell = affectedpredstatesV.at(sind);

            // translate to correct for the offset
            affectedcell.x = affectedcell.x + cell.x;
            affectedcell.y = affectedcell.y + cell.y;

            // insert only if it was actually generated
            affectedHashEntry = (this->*GetHashEntry)(affectedcell.x, affectedcell.y, affectedcell.theta);
            if (affectedHashEntry != NULL && affectedHashEntry->iteration < iteration) {
                preds_of_changededgesIDV->push_back(affectedHashEntry->stateID);
                affectedHashEntry->iteration = iteration; // mark as already inserted
            }
        }
    }
}